

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_inverse(void)

{
  int iVar1;
  vector3 *pvVar2;
  matrix4 *pmVar3;
  void *hasInverse;
  matrix4 scratchMatrix;
  vector3 scratchVector;
  matrix4 inverted;
  matrix4 identity;
  matrix4 originalMatrix;
  
  matrix4_identity((matrix4 *)((long)&inverted.field_0 + 0x38));
  matrix4_identity((matrix4 *)((long)&identity.field_0 + 0x38));
  pvVar2 = vector3_setf3((vector3 *)((long)&scratchMatrix.field_0 + 0x38),0.5,0.5,0.5);
  pmVar3 = matrix4_make_transformation_scalingv3((matrix4 *)((long)&hasInverse + 4),pvVar2);
  matrix4_multiply((matrix4 *)((long)&identity.field_0 + 0x38),pmVar3);
  pvVar2 = vector3_setf3((vector3 *)((long)&scratchMatrix.field_0 + 0x38),1.0,0.8,0.3);
  pmVar3 = matrix4_make_transformation_translationv3((matrix4 *)((long)&hasInverse + 4),pvVar2);
  matrix4_multiply((matrix4 *)((long)&identity.field_0 + 0x38),pmVar3);
  pmVar3 = matrix4_set_from_euler_anglesf3_EXP
                     ((matrix4 *)((long)&hasInverse + 4),1.5707964,1.5707964,1.5707964);
  matrix4_multiply((matrix4 *)((long)&identity.field_0 + 0x38),pmVar3);
  pmVar3 = matrix4_set((matrix4 *)((long)&scratchVector.field_0 + 4),
                       (matrix4 *)((long)&identity.field_0 + 0x38));
  pmVar3 = matrix4_invert(pmVar3);
  if (pmVar3 == (matrix4 *)0x0) {
    originalMatrix.field_0._56_8_ = anon_var_dwarf_8a0;
  }
  else {
    matrix4_identity((matrix4 *)((long)&hasInverse + 4));
    matrix4_multiply((matrix4 *)((long)&hasInverse + 4),
                     (matrix4 *)((long)&scratchVector.field_0 + 4));
    matrix4_multiply((matrix4 *)((long)&hasInverse + 4),(matrix4 *)((long)&identity.field_0 + 0x38))
    ;
    iVar1 = matrix4_equals((matrix4 *)((long)&inverted.field_0 + 0x38),
                           (matrix4 *)((long)&hasInverse + 4));
    if (iVar1 == 0) {
      originalMatrix.field_0._56_8_ = anon_var_dwarf_8ac;
    }
    else {
      originalMatrix.field_0._56_8_ = 0;
    }
  }
  return (char *)originalMatrix.field_0._56_8_;
}

Assistant:

static char *test_matrix4_inverse(void)
{
	struct matrix4 originalMatrix;
	struct matrix4 identity;
	struct matrix4 inverted;
	struct vector3 scratchVector;
	struct matrix4 scratchMatrix;
	void *hasInverse = NULL;

	matrix4_identity(&identity);

	matrix4_identity(&originalMatrix);
	matrix4_multiply(&originalMatrix, matrix4_make_transformation_scalingv3(&scratchMatrix, vector3_setf3(&scratchVector, 0.5f, 0.5f, 0.5f)));
	matrix4_multiply(&originalMatrix, matrix4_make_transformation_translationv3(&scratchMatrix, vector3_setf3(&scratchVector, 1.0f, 0.8f, 0.3f)));
	matrix4_multiply(&originalMatrix, matrix4_set_from_euler_anglesf3_EXP(&scratchMatrix, HYP_TAU / 4.0f, HYP_TAU / 4.0f, HYP_TAU / 4.0f));

	hasInverse = matrix4_invert(matrix4_set(&inverted, &originalMatrix));

	test_assert(hasInverse);

	matrix4_identity(&scratchMatrix);
	matrix4_multiply(&scratchMatrix, &inverted);
	matrix4_multiply(&scratchMatrix, &originalMatrix);

	test_assert(matrix4_equals(&identity, &scratchMatrix));

	return NULL;
}